

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

ZNode * binary_op_ZNode(SNode *sn)

{
  SNode *pSVar1;
  SNode *local_20;
  ZNode *z;
  SNode *sn_local;
  
  if ((sn->zns).n != 1) {
    return (ZNode *)0x0;
  }
  local_20 = (SNode *)*(sn->zns).v;
  if (((PNode *)(local_20->loc).s)->op_assoc == ASSOC_UNARY_RIGHT) {
    if (((VecSNode *)&(local_20->loc).pathname)->n != 1) {
      return (ZNode *)0x0;
    }
    pSVar1 = *(SNode **)(local_20->loc).ws;
    if ((pSVar1->zns).n != 1) {
      return (ZNode *)0x0;
    }
    local_20 = (SNode *)*(pSVar1->zns).v;
  }
  if ((((PNode *)(local_20->loc).s)->op_assoc & 0x10) == ASSOC_NONE) {
    sn_local = (SNode *)0x0;
  }
  else {
    sn_local = local_20;
  }
  return (ZNode *)sn_local;
}

Assistant:

static ZNode *binary_op_ZNode(SNode *sn) {
  ZNode *z;
  if (sn->zns.n != 1) return NULL;
  z = sn->zns.v[0];
  if (z->pn->op_assoc == ASSOC_UNARY_RIGHT) {
    if (z->sns.n != 1) return NULL;
    sn = z->sns.v[0];
    if (sn->zns.n != 1) return NULL;
    z = sn->zns.v[0];
  }
  if (!IS_BINARY_ASSOC(z->pn->op_assoc)) return NULL;
  return z;
}